

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_smooth_predictor_16x8_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  undefined1 auVar4 [15];
  unkuint9 Var5;
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  unkbyte10 Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  int c;
  long lVar14;
  undefined1 auVar15 [16];
  ushort uVar20;
  undefined1 auVar16 [15];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar12 = _DAT_005148c0;
  auVar11 = _DAT_005148b0;
  uVar2 = left[7];
  uVar3 = above[0xf];
  lVar13 = 0;
  do {
    uVar1 = smooth_weights[lVar13 + 4];
    lVar14 = 0;
    do {
      auVar15._2_2_ = uVar2;
      auVar15._0_2_ = above[lVar14];
      auVar15._4_2_ = left[lVar13];
      auVar15._6_2_ = uVar3;
      auVar15._8_8_ = 0;
      auVar16 = ~auVar12._0_15_ & ZEXT115((byte)-smooth_weights[lVar14 + 0xc]) << 0x18 |
                (~auVar11._0_15_ & ZEXT115(smooth_weights[lVar14 + 0xc]) << 0x10 |
                ZEXT215(CONCAT11(-uVar1,uVar1)) & auVar11._0_15_) & auVar12._0_15_;
      Var5 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar16[3]);
      auVar8._9_6_ = 0;
      auVar8._0_9_ = Var5;
      auVar6._1_10_ = SUB1510(auVar8 << 0x30,5);
      auVar6[0] = auVar16[2];
      auVar9._11_4_ = 0;
      auVar9._0_11_ = auVar6;
      auVar4[2] = auVar16[1];
      auVar4._0_2_ = auVar16._0_2_;
      auVar4._3_12_ = SUB1512(auVar9 << 0x20,3);
      auVar17._0_2_ = auVar16._0_2_ & 0xff;
      auVar17._2_13_ = auVar4._2_13_;
      auVar17[0xf] = 0;
      auVar15 = pmulhuw(auVar15,auVar17);
      uVar20 = (short)Var5 * uVar3;
      auVar18._0_10_ = (unkuint10)uVar20 << 0x30;
      auVar19._0_12_ = ZEXT212(uVar20) << 0x30;
      auVar19._12_2_ = uVar20;
      auVar19._14_2_ = auVar15._6_2_;
      auVar18._12_4_ = auVar19._12_4_;
      auVar18._10_2_ = auVar15._4_2_;
      Var10 = CONCAT64(auVar18._10_6_,CONCAT22(auVar6._0_2_ * left[lVar13],uVar20));
      auVar7._4_8_ = (long)((unkuint10)Var10 >> 0x10);
      auVar7._2_2_ = auVar15._2_2_;
      auVar7._0_2_ = auVar4._2_2_ * uVar2;
      dst[lVar14] = (uint16_t)
                    (auVar7._0_4_ + auVar18._12_4_ +
                     CONCAT22(auVar15._0_2_,auVar17._0_2_ * above[lVar14]) +
                     (int)((unkuint10)Var10 >> 0x10) + 0x100U >> 9);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x10);
    lVar13 = lVar13 + 1;
    dst = dst + stride;
  } while (lVar13 != 8);
  return;
}

Assistant:

static inline void highbd_smooth_predictor(uint16_t *dst, ptrdiff_t stride,
                                           int bw, int bh,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  (void)bd;
  const uint16_t below_pred = left[bh - 1];   // estimated by bottom-left pixel
  const uint16_t right_pred = above[bw - 1];  // estimated by top-right pixel
  const uint8_t *const sm_weights_w = smooth_weights + bw - 4;
  const uint8_t *const sm_weights_h = smooth_weights + bh - 4;
  // scale = 2 * 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = 1 + SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights_w, sm_weights_h, scale,
                           log2_scale + sizeof(*dst));
  int r;
  for (r = 0; r < bh; ++r) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint16_t pixels[] = { above[c], below_pred, left[r], right_pred };
      const uint8_t weights[] = { sm_weights_h[r], scale - sm_weights_h[r],
                                  sm_weights_w[c], scale - sm_weights_w[c] };
      uint32_t this_pred = 0;
      int i;
      assert(scale >= sm_weights_h[r] && scale >= sm_weights_w[c]);
      for (i = 0; i < 4; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}